

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode Curl_client_write(connectdata *conn,int type,char *ptr,size_t len)

{
  curl_off_t *pcVar1;
  undefined1 *puVar2;
  Curl_easy *pCVar3;
  byte bVar4;
  CURLcode CVar5;
  short *psVar6;
  curl_write_callback p_Var7;
  size_t sVar8;
  size_t sVar9;
  curl_write_callback p_Var10;
  size_t sVar11;
  char *pcVar12;
  short *psVar13;
  
  pCVar3 = conn->data;
  if (len == 0) {
    len = strlen(ptr);
  }
  if (((((type & 1U) != 0) && ((conn->handler->protocol & 0xc) != 0)) &&
      ((conn->proto).ftpc.transfertype == 'A')) && (len != 0 && ptr != (char *)0x0)) {
    bVar4 = (pCVar3->state).field_0x424;
    if ((bVar4 & 1) != 0) {
      if (*ptr == '\n') {
        len = len - 1;
        memmove(ptr,ptr + 1,len);
        pcVar1 = &(pCVar3->state).crlf_conversions;
        *pcVar1 = *pcVar1 + 1;
        bVar4 = (pCVar3->state).field_0x424;
      }
      (pCVar3->state).field_0x424 = bVar4 & 0xfe;
    }
    psVar6 = (short *)memchr(ptr,0xd,len);
    if (psVar6 != (short *)0x0) {
      psVar13 = psVar6;
      for (; psVar6 < ptr + (len - 1); psVar6 = (short *)((long)psVar6 + 1)) {
        if (*psVar6 == 0xa0d) {
          pcVar12 = (char *)((long)psVar6 + 1);
          psVar6 = (short *)((long)psVar6 + 1);
          *(char *)psVar13 = *pcVar12;
          pcVar1 = &(pCVar3->state).crlf_conversions;
          *pcVar1 = *pcVar1 + 1;
        }
        else if ((char)*psVar6 == '\r') {
          *(char *)psVar13 = '\n';
        }
        else {
          *(char *)psVar13 = (char)*psVar6;
        }
        psVar13 = (short *)((long)psVar13 + 1);
      }
      if (psVar6 < ptr + len) {
        if ((char)*psVar6 == '\r') {
          *(char *)psVar13 = '\n';
          puVar2 = &(pCVar3->state).field_0x424;
          *puVar2 = *puVar2 | 1;
        }
        else {
          *(char *)psVar13 = (char)*psVar6;
        }
        psVar13 = (short *)((long)psVar13 + 1);
      }
      if (psVar13 < ptr + len) {
        *(char *)psVar13 = '\0';
      }
      len = (long)psVar13 - (long)ptr;
    }
  }
  if (len == 0) {
    return CURLE_OK;
  }
  pCVar3 = conn->data;
  sVar9 = len;
  pcVar12 = ptr;
  if (((pCVar3->req).keepon & 0x10) != 0) goto LAB_00120375;
  if ((type & 1U) == 0) {
    p_Var10 = (curl_write_callback)0x0;
  }
  else {
    p_Var10 = (pCVar3->set).fwrite_func;
  }
  if ((type & 2U) == 0) {
LAB_0012039c:
    p_Var7 = (curl_write_callback)0x0;
  }
  else {
    p_Var7 = (pCVar3->set).fwrite_header;
    if (p_Var7 == (curl_write_callback)0x0) {
      if ((pCVar3->set).writeheader == (void *)0x0) goto LAB_0012039c;
      p_Var7 = (pCVar3->set).fwrite_func;
    }
  }
  for (; sVar9 != 0; sVar9 = sVar9 - sVar11) {
    sVar11 = 0x4000;
    if (sVar9 < 0x4000) {
      sVar11 = sVar9;
    }
    if (p_Var10 != (curl_write_callback)0x0) {
      Curl_set_in_callback(pCVar3,true);
      sVar8 = (*p_Var10)(pcVar12,1,sVar11,(pCVar3->set).out);
      Curl_set_in_callback(pCVar3,false);
      if (sVar8 == 0x10000001) {
        if ((conn->handler->flags & 0x10) == 0) goto LAB_00120375;
        pcVar12 = "Write callback asked for PAUSE when not supported!";
        goto LAB_001204e7;
      }
      if (sVar8 != sVar11) {
        Curl_failf(pCVar3,"Failed writing body (%zu != %zu)",sVar8,sVar11);
        return CURLE_WRITE_ERROR;
      }
    }
    pcVar12 = pcVar12 + sVar11;
  }
  if (p_Var7 == (curl_write_callback)0x0) {
    return CURLE_OK;
  }
  Curl_set_in_callback(pCVar3,true);
  sVar9 = (*p_Var7)(ptr,1,len,(pCVar3->set).writeheader);
  Curl_set_in_callback(pCVar3,false);
  if (sVar9 != 0x10000001) {
    if (sVar9 == len) {
      return CURLE_OK;
    }
    pcVar12 = "Failed writing header";
LAB_001204e7:
    Curl_failf(pCVar3,pcVar12);
    return CURLE_WRITE_ERROR;
  }
  type = 2;
  sVar9 = len;
  pcVar12 = ptr;
LAB_00120375:
  CVar5 = pausewrite(pCVar3,type,pcVar12,sVar9);
  return CVar5;
}

Assistant:

CURLcode Curl_client_write(struct connectdata *conn,
                           int type,
                           char *ptr,
                           size_t len)
{
  struct Curl_easy *data = conn->data;

  if(0 == len)
    len = strlen(ptr);

  DEBUGASSERT(type <= 3);

  /* FTP data may need conversion. */
  if((type & CLIENTWRITE_BODY) &&
    (conn->handler->protocol & PROTO_FAMILY_FTP) &&
    conn->proto.ftpc.transfertype == 'A') {
    /* convert from the network encoding */
    CURLcode result = Curl_convert_from_network(data, ptr, len);
    /* Curl_convert_from_network calls failf if unsuccessful */
    if(result)
      return result;

#ifdef CURL_DO_LINEEND_CONV
    /* convert end-of-line markers */
    len = convert_lineends(data, ptr, len);
#endif /* CURL_DO_LINEEND_CONV */
    }

  return chop_write(conn, type, ptr, len);
}